

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.h
# Opt level: O3

bool __thiscall
luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
          (StackAPI *this,int minCount,ValueT types,ValueT types_1,ValueT types_2)

{
  bool bVar1;
  int params;
  
  params = GetStackSize(this);
  if (params < minCount) {
    ArgCountError(this,minCount);
    return false;
  }
  bVar1 = CheckArgs<luna::ValueT,luna::ValueT>(this,0,params,types,types_1,types_2);
  return bVar1;
}

Assistant:

bool CheckArgs(int minCount, ValueTypes... types)
        {
            // Check count of arguments
            auto params = GetStackSize();
            if (params < minCount)
            {
                ArgCountError(minCount);
                return false;
            }

            return CheckArgs(0, params, types...);
        }